

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_Accessors_Test::TestBody
          (GeneratedMessageReflectionTest_Accessors_Test *this)

{
  Descriptor *base_descriptor;
  ReflectionTester reflection_tester;
  TestAllTypes message;
  ReflectionTester RStack_3c8;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348);
  base_descriptor = proto2_unittest::TestAllTypes::GetDescriptor();
  TestUtil::ReflectionTester::ReflectionTester(&RStack_3c8,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&RStack_3c8,&local_348.super_Message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection(&RStack_3c8,&local_348.super_Message);
  TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection
            (&RStack_3c8,&local_348.super_Message);
  TestUtil::ExpectRepeatedFieldsModified<proto2_unittest::TestAllTypes>(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, Accessors) {
  // Set every field to a unique value then go back and check all those
  // values.
  unittest::TestAllTypes message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  reflection_tester.SetAllFieldsViaReflection(&message);
  TestUtil::ExpectAllFieldsSet(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(message);

  reflection_tester.ModifyRepeatedFieldsViaReflection(&message);
  TestUtil::ExpectRepeatedFieldsModified(message);
}